

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O2

int ecx_setupnic(ecx_portt *port,char *ifname,int secondary)

{
  uint8 *puVar1;
  undefined4 uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  ecx_portt *peVar6;
  undefined4 local_84;
  timeval timeout;
  sockaddr_ll sll;
  ifreq ifr;
  
  if (secondary == 0) {
    pthread_mutex_init((pthread_mutex_t *)&port->getindex_mutex,(pthread_mutexattr_t *)0x0);
    pthread_mutex_init((pthread_mutex_t *)&port->tx_mutex,(pthread_mutexattr_t *)0x0);
    pthread_mutex_init((pthread_mutex_t *)&port->rx_mutex,(pthread_mutexattr_t *)0x0);
    port->sockhandle = -1;
    port->lastidx = 0;
    port->redstate = 0;
    (port->stack).sock = &port->sockhandle;
    peVar6 = port;
  }
  else {
    peVar6 = (ecx_portt *)port->redport;
    if (peVar6 == (ecx_portt *)0x0) {
      return 0;
    }
    peVar6->sockhandle = -1;
    port->redstate = 1;
    (peVar6->stack).sock = &peVar6->sockhandle;
  }
  (peVar6->stack).txbuf = &port->txbuf;
  (peVar6->stack).txbuflength = &port->txbuflength;
  (peVar6->stack).tempbuf = &peVar6->tempinbuf;
  (peVar6->stack).rxbuf = &peVar6->rxbuf;
  (peVar6->stack).rxbufstat = &peVar6->rxbufstat;
  (peVar6->stack).rxsa = &peVar6->rxsa;
  iVar3 = socket(0x11,3,0xa488);
  peVar6->sockhandle = iVar3;
  timeout.tv_sec = 0;
  timeout.tv_usec = 1;
  setsockopt(iVar3,1,0x14,&timeout,0x10);
  setsockopt(peVar6->sockhandle,1,0x15,&timeout,0x10);
  local_84 = 1;
  setsockopt(peVar6->sockhandle,1,5,&local_84,4);
  strcpy((char *)&ifr,ifname);
  ioctl(peVar6->sockhandle,0x8933,&ifr);
  uVar2 = ifr.ifr_ifru.ifru_ivalue;
  strcpy((char *)&ifr,ifname);
  ifr.ifr_ifru.ifru_ivalue = ifr.ifr_ifru.ifru_ivalue & 0xffff0000;
  ioctl(peVar6->sockhandle,0x8913,&ifr);
  ifr.ifr_ifru.ifru_addr.sa_family = 1;
  ioctl(peVar6->sockhandle,0x8913,&ifr);
  sll.sll_family = 0x11;
  sll.sll_protocol = 0xa488;
  sll.sll_ifindex = uVar2;
  iVar3 = bind(peVar6->sockhandle,(sockaddr *)&sll,0x14);
  piVar4 = port->rxbufstat;
  for (lVar5 = 0; lVar5 != 0x5ee0; lVar5 = lVar5 + 0x5ee) {
    puVar1 = port->txbuf[0] + lVar5;
    puVar1[0] = 0xff;
    puVar1[1] = 0xff;
    puVar1[2] = 0xff;
    puVar1[3] = 0xff;
    puVar1[4] = 0xff;
    puVar1[5] = 0xff;
    puVar1[6] = '\x01';
    puVar1[7] = '\x01';
    puVar1 = port->txbuf[0] + lVar5 + 8;
    puVar1[0] = '\x01';
    puVar1[1] = '\x01';
    puVar1[2] = '\x01';
    puVar1[3] = '\x01';
    puVar1 = port->txbuf[0] + lVar5 + 0xc;
    puVar1[0] = 0x88;
    puVar1[1] = 0xa4;
    *piVar4 = 0;
    piVar4 = piVar4 + 1;
  }
  port->txbuf2[0] = 0xff;
  port->txbuf2[1] = 0xff;
  port->txbuf2[2] = 0xff;
  port->txbuf2[3] = 0xff;
  port->txbuf2[4] = 0xff;
  port->txbuf2[5] = 0xff;
  port->txbuf2[6] = '\x01';
  port->txbuf2[7] = '\x01';
  port->txbuf2[8] = '\x01';
  port->txbuf2[9] = '\x01';
  port->txbuf2[10] = '\x01';
  port->txbuf2[0xb] = '\x01';
  port->txbuf2[0xc] = 0x88;
  port->txbuf2[0xd] = 0xa4;
  return (uint)(iVar3 == 0);
}

Assistant:

int ecx_setupnic(ecx_portt *port, const char *ifname, int secondary) 
{
   int i;
   int r, rval, ifindex;
   struct timeval timeout;
   struct ifreq ifr;
   struct sockaddr_ll sll;
   int *psock;

   rval = 0;
   if (secondary)
   {
      /* secondary port stuct available? */
      if (port->redport)
      {
         /* when using secondary socket it is automatically a redundant setup */
         psock = &(port->redport->sockhandle);
         *psock = -1;
         port->redstate                   = ECT_RED_DOUBLE;
         port->redport->stack.sock        = &(port->redport->sockhandle);
         port->redport->stack.txbuf       = &(port->txbuf);
         port->redport->stack.txbuflength = &(port->txbuflength);
         port->redport->stack.tempbuf     = &(port->redport->tempinbuf);
         port->redport->stack.rxbuf       = &(port->redport->rxbuf);
         port->redport->stack.rxbufstat   = &(port->redport->rxbufstat);
         port->redport->stack.rxsa        = &(port->redport->rxsa);
      }
      else
      {
         /* fail */
         return 0;
      }
   }
   else
   {

#ifdef RTNET
      rt_mutex_create(&port->getindex_mutex, "getindex_mutex");
      rt_mutex_create(&port->tx_mutex, "tx_mutex");
      rt_mutex_create(&port->rx_mutex, "rx_mutex");
#else
      pthread_mutex_init(&(port->getindex_mutex), NULL);
      pthread_mutex_init(&(port->tx_mutex)      , NULL);
      pthread_mutex_init(&(port->rx_mutex)      , NULL);
#endif //RTNET

      port->sockhandle        = -1;
      port->lastidx           = 0;
      port->redstate          = ECT_RED_NONE;
      port->stack.sock        = &(port->sockhandle);
      port->stack.txbuf       = &(port->txbuf);
      port->stack.txbuflength = &(port->txbuflength);
      port->stack.tempbuf     = &(port->tempinbuf);
      port->stack.rxbuf       = &(port->rxbuf);
      port->stack.rxbufstat   = &(port->rxbufstat);
      port->stack.rxsa        = &(port->rxsa);
      psock = &(port->sockhandle);
   }   
   /* we use RAW packet socket, with packet type ETH_P_ECAT */
   *psock = SOCKET(PF_PACKET, SOCK_RAW, htons(ETH_P_ECAT));
   
   timeout.tv_sec =  0;
   timeout.tv_usec = 1; 
   r = SETSOCKOPT(*psock, SOL_SOCKET, SO_RCVTIMEO, &timeout, sizeof(timeout));
   r = SETSOCKOPT(*psock, SOL_SOCKET, SO_SNDTIMEO, &timeout, sizeof(timeout));
   i = 1;
   r = SETSOCKOPT(*psock, SOL_SOCKET, SO_DONTROUTE, &i, sizeof(i));
   /* connect socket to NIC by name */
   strcpy(ifr.ifr_name, ifname);
   r = IOCTL(*psock, SIOCGIFINDEX, &ifr);
   ifindex = ifr.ifr_ifindex;
   strcpy(ifr.ifr_name, ifname);
   ifr.ifr_flags = 0;
   /* reset flags of NIC interface */
   r = IOCTL(*psock, SIOCGIFFLAGS, &ifr);
   /* set flags of NIC interface, here promiscuous and broadcast */
   ifr.ifr_flags = ifr.ifr_flags || IFF_PROMISC || IFF_BROADCAST;
   r = IOCTL(*psock, SIOCGIFFLAGS, &ifr);
   /* bind socket to protocol, in this case RAW EtherCAT */
   sll.sll_family = AF_PACKET;
   sll.sll_ifindex = ifindex;
   sll.sll_protocol = htons(ETH_P_ECAT);
   r = BIND(*psock, (struct sockaddr *)&sll, sizeof(sll));
   /* setup ethernet headers in tx buffers so we don't have to repeat it */
   for (i = 0; i < EC_MAXBUF; i++) 
   {
      ec_setupheader(&(port->txbuf[i]));
      port->rxbufstat[i] = EC_BUF_EMPTY;
   }
   ec_setupheader(&(port->txbuf2));
   if (r == 0) rval = 1;
   
   return rval;
}